

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

void __thiscall
sf::RenderTarget::setupDraw(RenderTarget *this,bool useVertexCache,RenderStates *states)

{
  byte bVar1;
  bool bVar2;
  Uint64 UVar3;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  socklen_t extraout_EDX_01;
  socklen_t __len;
  Texture *texture;
  RenderTarget *this_00;
  
  this_00 = this;
  if ((this->m_cache).glStatesSet == false) {
    resetGLStates(this);
  }
  if (useVertexCache) {
    if (((this->m_cache).enable != true) || ((this->m_cache).useVertexCache == false)) {
      glLoadIdentity();
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                         ,0x297,"glLoadIdentity()");
    }
  }
  else {
    applyTransform(this_00,&states->transform);
  }
  if (((this->m_cache).enable != true) || (bVar1 = 1, (this->m_cache).viewChanged == true)) {
    applyCurrentView(this);
    bVar1 = (this->m_cache).enable;
  }
  if ((bVar1 & 1) == 0) {
LAB_00130639:
    applyBlendMode(this,&states->blendMode);
    __len = extraout_EDX_00;
  }
  else {
    bVar2 = operator!=(&states->blendMode,&(this->m_cache).lastBlendMode);
    __len = extraout_EDX;
    if (bVar2) goto LAB_00130639;
  }
  texture = states->texture;
  if ((this->m_cache).enable == true) {
    if (texture == (Texture *)0x0) {
      UVar3 = 0;
    }
    else {
      if (texture->m_fboAttachment != false) goto LAB_0013066e;
      UVar3 = texture->m_cacheId;
    }
    if (UVar3 == (this->m_cache).lastTextureId) goto LAB_00130676;
  }
LAB_0013066e:
  applyTexture(this,texture);
  __len = extraout_EDX_01;
LAB_00130676:
  if (states->shader != (Shader *)0x0) {
    Shader::bind((int)states->shader,(sockaddr *)texture,__len);
    return;
  }
  return;
}

Assistant:

void RenderTarget::setupDraw(bool useVertexCache, const RenderStates& states)
{
    // First set the persistent OpenGL states if it's the very first call
    if (!m_cache.glStatesSet)
        resetGLStates();

    if (useVertexCache)
    {
        // Since vertices are transformed, we must use an identity transform to render them
        if (!m_cache.enable || !m_cache.useVertexCache)
            glCheck(glLoadIdentity());
    }
    else
    {
        applyTransform(states.transform);
    }

    // Apply the view
    if (!m_cache.enable || m_cache.viewChanged)
        applyCurrentView();

    // Apply the blend mode
    if (!m_cache.enable || (states.blendMode != m_cache.lastBlendMode))
        applyBlendMode(states.blendMode);

    // Apply the texture
    if (!m_cache.enable || (states.texture && states.texture->m_fboAttachment))
    {
        // If the texture is an FBO attachment, always rebind it
        // in order to inform the OpenGL driver that we want changes
        // made to it in other contexts to be visible here as well
        // This saves us from having to call glFlush() in
        // RenderTextureImplFBO which can be quite costly
        // See: https://www.khronos.org/opengl/wiki/Memory_Model
        applyTexture(states.texture);
    }
    else
    {
        Uint64 textureId = states.texture ? states.texture->m_cacheId : 0;
        if (textureId != m_cache.lastTextureId)
            applyTexture(states.texture);
    }

    // Apply the shader
    if (states.shader)
        applyShader(states.shader);
}